

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

StructurePtr __thiscall soul::heart::Parser::findStruct(Parser *this,string *name)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  Structure *s;
  _func_int **pp_Var4;
  _Alloc_hider _Var5;
  int iVar6;
  long *plVar7;
  undefined8 *in_RDX;
  long lVar8;
  bool bVar9;
  string_view name_00;
  pool_ptr<const_soul::Module> local_58;
  string local_50;
  
  if (name[4]._M_string_length == 0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  name_00._M_len = name[4]._M_string_length + 0x368;
  name_00._M_str = (char *)in_RDX[1];
  Module::Structs::find((Structs *)this,name_00);
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser == (_func_int **)0x0) {
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
    lVar1 = *(long *)((long)&name[3].field_2 + 8);
    plVar2 = *(long **)(lVar1 + 0x48);
    for (plVar7 = *(long **)(lVar1 + 0x40); plVar7 != plVar2; plVar7 = plVar7 + 1) {
      lVar1 = *(long *)(*plVar7 + 0x370);
      if (lVar1 != 0) {
        lVar3 = *(long *)(*plVar7 + 0x368);
        lVar8 = 0;
        do {
          s = *(Structure **)(lVar3 + lVar8);
          if (s == (Structure *)0x0) {
            throwInternalCompilerError("object != nullptr","operator*",0x46);
          }
          local_58.object = (Module *)0x0;
          Program::ProgramImpl::getStructNameWithQualificationIfNeeded_abi_cxx11_
                    (&local_50,*(ProgramImpl **)((long)&name[3].field_2 + 8),&local_58,s);
          _Var5._M_p = local_50._M_dataplus._M_p;
          if (local_50._M_string_length == in_RDX[1]) {
            if (local_50._M_string_length == 0) {
              bVar9 = true;
            }
            else {
              iVar6 = bcmp(local_50._M_dataplus._M_p,(void *)*in_RDX,local_50._M_string_length);
              bVar9 = iVar6 == 0;
            }
          }
          else {
            bVar9 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != &local_50.field_2) {
            operator_delete(_Var5._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (bVar9) {
            pp_Var4 = *(_func_int ***)(lVar3 + lVar8);
            (this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            )._vptr_Tokeniser = pp_Var4;
            if (pp_Var4 == (_func_int **)0x0) {
              return (StructurePtr)(Structure *)this;
            }
            *(int *)pp_Var4 = *(int *)pp_Var4 + 1;
            return (StructurePtr)(Structure *)this;
          }
          lVar8 = lVar8 + 8;
        } while (lVar1 << 3 != lVar8);
      }
    }
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser = (_func_int **)0x0;
  }
  return (StructurePtr)(Structure *)this;
}

Assistant:

StructurePtr findStruct (const std::string& name)
    {
        if (auto s = module->structs.find (name))
            return s;

        for (auto& m : program.getModules())
            for (auto& s : m->structs.get())
                if (program.getFullyQualifiedStructName (*s) == name)
                    return s;

        return {};
    }